

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzerSettings.cpp
# Opt level: O2

void __thiscall
ManchesterAnalyzerSettings::ManchesterAnalyzerSettings(ManchesterAnalyzerSettings *this)

{
  Channel *this_00;
  auto_ptr<AnalyzerSettingInterfaceChannel> *this_01;
  auto_ptr<AnalyzerSettingInterfaceNumberList> *this_02;
  auto_ptr<AnalyzerSettingInterfaceInteger> *this_03;
  auto_ptr<AnalyzerSettingInterfaceNumberList> *this_04;
  auto_ptr<AnalyzerSettingInterfaceNumberList> *this_05;
  auto_ptr<AnalyzerSettingInterfaceNumberList> *this_06;
  auto_ptr<AnalyzerSettingInterfaceInteger> *this_07;
  auto_ptr<AnalyzerSettingInterfaceNumberList> *this_08;
  AnalyzerSettingInterfaceChannel *this_09;
  AnalyzerSettingInterfaceNumberList *pAVar1;
  AnalyzerSettingInterfaceInteger *pAVar2;
  ostream *poVar3;
  Channel *pCVar4;
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  char *local_1d8 [4];
  stringstream ss;
  ostream local_1a8 [376];
  
  AnalyzerSettings::AnalyzerSettings(&this->super_AnalyzerSettings);
  *(undefined ***)this = &PTR__ManchesterAnalyzerSettings_0010cd70;
  this_00 = &this->mInputChannel;
  uVar6 = 0xffffffffffffffff;
  Channel::Channel(this_00,0xffffffffffffffff,0xffffffff,DIGITAL_CHANNEL);
  this->mMode = MANCHESTER;
  this->mBitRate = 0x5dc;
  this->mInverted = false;
  this->mBitsPerTransfer = 8;
  this->mShiftOrder = LsbFirst;
  this->mBitsToIgnore = 0;
  this->mTolerance = TOL25;
  this_01 = &this->mInputChannelInterface;
  this_02 = &this->mModeInterface;
  this_03 = &this->mBitRateInterface;
  this_04 = &this->mInvertedInterface;
  this_05 = &this->mBitsPerTransferInterface;
  this_06 = &this->mShiftOrderInterface;
  this_07 = &this->mNumBitsIgnoreInterface;
  this_08 = &this->mToleranceInterface;
  (this->mInputChannelInterface)._M_ptr = (AnalyzerSettingInterfaceChannel *)0x0;
  (this->mModeInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mBitRateInterface)._M_ptr = (AnalyzerSettingInterfaceInteger *)0x0;
  (this->mInvertedInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mBitsPerTransferInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mShiftOrderInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  (this->mNumBitsIgnoreInterface)._M_ptr = (AnalyzerSettingInterfaceInteger *)0x0;
  (this->mToleranceInterface)._M_ptr = (AnalyzerSettingInterfaceNumberList *)0x0;
  this_09 = (AnalyzerSettingInterfaceChannel *)
            AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar6);
  AnalyzerSettingInterfaceChannel::AnalyzerSettingInterfaceChannel(this_09);
  std::auto_ptr<AnalyzerSettingInterfaceChannel>::reset(this_01,this_09);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_01->_M_ptr,"Manchester");
  pCVar4 = this_00;
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)this_01->_M_ptr);
  pAVar1 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pCVar4);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(this_02,pAVar1);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_02->_M_ptr,"Mode");
  AnalyzerSettingInterfaceNumberList::AddNumber(0.0,(char *)this_02->_M_ptr,"Manchester");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)this_02->_M_ptr,"Differential Manchester");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (2.0,(char *)this_02->_M_ptr,"Bi-Phase Mark Code (FM1)");
  pcVar5 = "Bi-Phase Space Code (FM0)";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (3.0,(char *)this_02->_M_ptr,"Bi-Phase Space Code (FM0)");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mMode);
  pAVar2 = (AnalyzerSettingInterfaceInteger *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar5);
  AnalyzerSettingInterfaceInteger::AnalyzerSettingInterfaceInteger(pAVar2);
  std::auto_ptr<AnalyzerSettingInterfaceInteger>::reset(this_03,pAVar2);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_03->_M_ptr,"Bit Rate (Bits/s)");
  AnalyzerSettingInterfaceInteger::SetMax((int)this_03->_M_ptr);
  AnalyzerSettingInterfaceInteger::SetMin((int)this_03->_M_ptr);
  uVar6 = (ulong)this->mBitRate;
  AnalyzerSettingInterfaceInteger::SetInteger((int)(this->mBitRateInterface)._M_ptr);
  pAVar1 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar6);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(this_04,pAVar1);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_04->_M_ptr,"Edge Polarity");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)this_04->_M_ptr,"negative edge is binary one");
  pcVar5 = "negative edge is binary zero";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)this_04->_M_ptr,"negative edge is binary zero");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)(int)this->mInverted);
  pAVar1 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar5);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(this_05,pAVar1);
  pcVar5 = "Bits Per Frame";
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_05->_M_ptr,"Bits Per Frame");
  for (lVar8 = 1; lVar8 != 0x41; lVar8 = lVar8 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    pcVar5 = "1 Bit per Transfer";
    poVar3 = local_1a8;
    if (lVar8 != 1) {
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      pcVar5 = " Bits per Transfer";
    }
    std::operator<<(poVar3,pcVar5);
    pAVar1 = this_05->_M_ptr;
    std::__cxx11::stringbuf::str();
    pcVar5 = local_1d8[0];
    AnalyzerSettingInterfaceNumberList::AddNumber((double)(int)lVar8,(char *)pAVar1,local_1d8[0]);
    std::__cxx11::string::~string((string *)local_1d8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mBitsPerTransfer);
  pAVar1 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar5);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(this_06,pAVar1);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_06->_M_ptr,"Significant Bit");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (1.0,(char *)this_06->_M_ptr,"Least Significant Bit Sent First");
  pcVar5 = "Most Significant Bit Sent First";
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)this_06->_M_ptr,"Most Significant Bit Sent First");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mShiftOrder);
  pAVar2 = (AnalyzerSettingInterfaceInteger *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,(ulong)pcVar5);
  AnalyzerSettingInterfaceInteger::AnalyzerSettingInterfaceInteger(pAVar2);
  std::auto_ptr<AnalyzerSettingInterfaceInteger>::reset(this_07,pAVar2);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_07->_M_ptr,"Preamble bits to ignore");
  AnalyzerSettingInterfaceInteger::SetMax((int)this_07->_M_ptr);
  AnalyzerSettingInterfaceInteger::SetMin((int)this_07->_M_ptr);
  uVar6 = (ulong)this->mBitsToIgnore;
  AnalyzerSettingInterfaceInteger::SetInteger((int)(this->mNumBitsIgnoreInterface)._M_ptr);
  pAVar1 = (AnalyzerSettingInterfaceNumberList *)
           AnalyzerSettingInterface::operator_new((AnalyzerSettingInterface *)0x18,uVar6);
  AnalyzerSettingInterfaceNumberList::AnalyzerSettingInterfaceNumberList(pAVar1);
  std::auto_ptr<AnalyzerSettingInterfaceNumberList>::reset(this_08,pAVar1);
  AnalyzerSettingInterface::SetTitleAndTooltip((char *)this_08->_M_ptr,"Tolerance");
  AnalyzerSettingInterfaceNumberList::AddNumber
            (0.0,(char *)this_08->_M_ptr,"25% of period (default)");
  AnalyzerSettingInterfaceNumberList::AddNumber(1.0,(char *)this_08->_M_ptr,"5% of period");
  AnalyzerSettingInterfaceNumberList::AddNumber(2.0,(char *)this_08->_M_ptr,"0.5% of period");
  AnalyzerSettingInterfaceNumberList::SetNumber((double)this->mTolerance);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  AnalyzerSettings::AddInterface((AnalyzerSettingInterface *)this);
  uVar7 = (uint)this;
  AnalyzerSettings::AddExportOption(uVar7,(char *)0x0);
  AnalyzerSettings::AddExportExtension(uVar7,(char *)0x0,"text");
  AnalyzerSettings::AddExportExtension(uVar7,(char *)0x0,"csv");
  AnalyzerSettings::ClearChannels();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)this_00,true);
  return;
}

Assistant:

ManchesterAnalyzerSettings::ManchesterAnalyzerSettings()
    : mInputChannel( UNDEFINED_CHANNEL ),
      mMode( MANCHESTER ),
      mBitRate( 1500 ),
      mInverted( false ),
      mBitsPerTransfer( 8 ),
      mShiftOrder( AnalyzerEnums::LsbFirst ),
      mBitsToIgnore( 0 ),
      mTolerance( TOL25 )
{
    mInputChannelInterface.reset( new AnalyzerSettingInterfaceChannel() );
    mInputChannelInterface->SetTitleAndTooltip( "Manchester", "Manchester" );
    mInputChannelInterface->SetChannel( mInputChannel );

    mModeInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mModeInterface->SetTitleAndTooltip( "Mode", "Specify the Manchester Mode" );
    mModeInterface->AddNumber( MANCHESTER, "Manchester", "" );
    mModeInterface->AddNumber( DIFFERENTIAL_MANCHESTER, "Differential Manchester", "" );
    mModeInterface->AddNumber( BI_PHASE_MARK, "Bi-Phase Mark Code (FM1)", "" );
    mModeInterface->AddNumber( BI_PHASE_SPACE, "Bi-Phase Space Code (FM0)", "" );
    mModeInterface->SetNumber( mMode );

    mBitRateInterface.reset( new AnalyzerSettingInterfaceInteger() );
    mBitRateInterface->SetTitleAndTooltip( "Bit Rate (Bits/s)", "Specify the bit rate in bits per second." );
    mBitRateInterface->SetMax( 100000000 );
    mBitRateInterface->SetMin( 1 );
    mBitRateInterface->SetInteger( mBitRate );

    mInvertedInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mInvertedInterface->SetTitleAndTooltip( "Edge Polarity", "Specify the Manchester edge polarity (Normal Manchester mode only)" );
    mInvertedInterface->AddNumber( false, "negative edge is binary one", "" );
    mInvertedInterface->AddNumber( true, "negative edge is binary zero", "" );
    mInvertedInterface->SetNumber( mInverted );

    mBitsPerTransferInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mBitsPerTransferInterface->SetTitleAndTooltip( "Bits Per Frame", "Select the number of bits per frame" );
    for( U32 i = 1; i <= 64; i++ )
    {
        std::stringstream ss;

        if( i == 1 )
            ss << "1 Bit per Transfer";
        else
            ss << i << " Bits per Transfer";

        mBitsPerTransferInterface->AddNumber( i, ss.str().c_str(), "" );
    }
    mBitsPerTransferInterface->SetNumber( mBitsPerTransfer );

    mShiftOrderInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mShiftOrderInterface->SetTitleAndTooltip( "Significant Bit",
                                              "Select if the most significant bit or least significant bit is transmitted first" );
    mShiftOrderInterface->AddNumber( AnalyzerEnums::LsbFirst, "Least Significant Bit Sent First", "" );
    mShiftOrderInterface->AddNumber( AnalyzerEnums::MsbFirst, "Most Significant Bit Sent First", "" );
    mShiftOrderInterface->SetNumber( mShiftOrder );


    mNumBitsIgnoreInterface.reset( new AnalyzerSettingInterfaceInteger() );
    mNumBitsIgnoreInterface->SetTitleAndTooltip( "Preamble bits to ignore", "Specify the number of preamble bits to ignore." );
    mNumBitsIgnoreInterface->SetMax( 1000 );
    mNumBitsIgnoreInterface->SetMin( 0 );
    mNumBitsIgnoreInterface->SetInteger( mBitsToIgnore );

    mToleranceInterface.reset( new AnalyzerSettingInterfaceNumberList() );
    mToleranceInterface->SetTitleAndTooltip( "Tolerance", "Specify the Manchester Tolerance as a percentage of period" );
    mToleranceInterface->AddNumber( TOL25, "25% of period (default)", "Maximum allowed tolerance, +- 50% of one half period" );
    mToleranceInterface->AddNumber( TOL5, "5% of period", "Required more than 10x over sampling" );
    mToleranceInterface->AddNumber( TOL05, "0.5% of period", "Requires more than 200x over sampling" );
    mToleranceInterface->SetNumber( mTolerance );

    AddInterface( mInputChannelInterface.get() );
    AddInterface( mModeInterface.get() );
    AddInterface( mBitRateInterface.get() );
    AddInterface( mInvertedInterface.get() );
    AddInterface( mBitsPerTransferInterface.get() );
    AddInterface( mShiftOrderInterface.get() );
    AddInterface( mNumBitsIgnoreInterface.get() );
    AddInterface( mToleranceInterface.get() );

    AddExportOption( 0, "Export as text/csv file" );
    AddExportExtension( 0, "text", "txt" );
    AddExportExtension( 0, "csv", "csv" );

    ClearChannels();
    AddChannel( mInputChannel, "Manchester", false );
}